

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddAbs.c
# Opt level: O0

int addCheckPositiveCube(DdManager *manager,DdNode *cube)

{
  DdNode *cube_local;
  DdManager *manager_local;
  
  if (((ulong)cube & 1) == 0) {
    if (cube == manager->one) {
      manager_local._4_4_ = 1;
    }
    else if (cube->index == 0x7fffffff) {
      manager_local._4_4_ = 0;
    }
    else if ((cube->type).kids.E == manager->zero) {
      manager_local._4_4_ = addCheckPositiveCube(manager,(cube->type).kids.T);
    }
    else {
      manager_local._4_4_ = 0;
    }
  }
  else {
    manager_local._4_4_ = 0;
  }
  return manager_local._4_4_;
}

Assistant:

static int
addCheckPositiveCube(
  DdManager * manager,
  DdNode * cube)
{
    if (Cudd_IsComplement(cube)) return(0);
    if (cube == DD_ONE(manager)) return(1);
    if (cuddIsConstant(cube)) return(0);
    if (cuddE(cube) == DD_ZERO(manager)) {
        return(addCheckPositiveCube(manager, cuddT(cube)));
    }
    return(0);

}